

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O1

void __thiscall MemoryManager::~MemoryManager(MemoryManager *this)

{
  uint32_t i;
  long lVar1;
  uint32_t j;
  long lVar2;
  
  lVar1 = 0;
  do {
    if (this->memory[lVar1] != (uint8_t **)0x0) {
      lVar2 = 0;
      do {
        if (this->memory[lVar1][lVar2] != (uint8_t *)0x0) {
          operator_delete__(this->memory[lVar1][lVar2]);
          this->memory[lVar1][lVar2] = (uint8_t *)0x0;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x400);
      if (this->memory[lVar1] != (uint8_t **)0x0) {
        operator_delete__(this->memory[lVar1]);
      }
      this->memory[lVar1] = (uint8_t **)0x0;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x400);
  return;
}

Assistant:

MemoryManager::~MemoryManager() {
  for (uint32_t i = 0; i < 1024; ++i) {
    if (this->memory[i] != nullptr) {
      for (uint32_t j = 0; j < 1024; ++j) {
        if (this->memory[i][j] != nullptr) {
          delete[] this->memory[i][j];
          this->memory[i][j] = nullptr;
        }
      }
      delete[] this->memory[i];
      this->memory[i] = nullptr;
    }
  }
}